

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

Slice __thiscall leveldb::FilterBlockBuilder::Finish(FilterBlockBuilder *this)

{
  long lVar1;
  Slice SVar2;
  bool bVar3;
  size_type sVar4;
  long in_RDI;
  string *dst;
  long in_FS_OFFSET;
  size_t i;
  uint32_t array_offset;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  Slice *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  char __c;
  undefined8 local_30;
  undefined8 local_18;
  FilterBlockBuilder *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffffa8);
  if (!bVar3) {
    GenerateFilter(in_stack_fffffffffffffff0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_30 = 0;
  while( true ) {
    __c = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (sVar4 <= local_30) break;
    in_stack_ffffffffffffffb8 = in_RDI + 0x40;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffa8,
               (size_type)in_stack_ffffffffffffffa0);
    PutFixed32(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_30 = local_30 + 1;
  }
  dst = (string *)(in_RDI + 0x40);
  PutFixed32(dst,in_stack_ffffffffffffff9c);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (in_stack_ffffffffffffffb0,__c);
  Slice::Slice(in_stack_ffffffffffffffa8,dst);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar2.size_ = (size_t)in_stack_fffffffffffffff0;
    SVar2.data_ = local_18;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice FilterBlockBuilder::Finish() {
  if (!start_.empty()) {
    GenerateFilter();
  }

  // Append array of per-filter offsets
  const uint32_t array_offset = result_.size();
  for (size_t i = 0; i < filter_offsets_.size(); i++) {
    PutFixed32(&result_, filter_offsets_[i]);
  }

  PutFixed32(&result_, array_offset);
  result_.push_back(kFilterBaseLg);  // Save encoding parameter in result
  return Slice(result_);
}